

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadLayerOffsetArray
          (CrateReader *this,
          vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *d)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint64_t n;
  ostringstream ss_e;
  uint64_t local_1c0 [5];
  ostringstream local_198 [376];
  
  local_1c0[0] = 0;
  bVar1 = StreamReader::read8(this->_sr,local_1c0);
  if (bVar1) {
    if ((this->_config).maxArrayElements < local_1c0[0]) {
      ::std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x44a);
      ::std::operator<<(poVar2," ");
      pcVar5 = "Too many array elements.";
    }
    else {
      if (local_1c0[0] == 0) {
        return true;
      }
      uVar3 = local_1c0[0] * 0x10 + this->_memoryUsage;
      this->_memoryUsage = uVar3;
      if ((this->_config).maxMemoryBudget < uVar3) {
        ::std::__cxx11::ostringstream::ostringstream(local_198);
        poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x451);
        ::std::operator<<(poVar2," ");
        pcVar5 = "Reached to max memory budget.";
      }
      else {
        ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::resize
                  (d,local_1c0[0]);
        sVar4 = StreamReader::read(this->_sr,(int)(void *)(local_1c0[0] << 4),
                                   (void *)(local_1c0[0] << 4),
                                   (size_t)(d->
                                           super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
        if (sVar4 != 0) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_198);
        poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x458);
        ::std::operator<<(poVar2," ");
        pcVar5 = "Failed to read LayerOffset[] data.";
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x445);
    ::std::operator<<(poVar2," ");
    pcVar5 = "Failed to read the number of array elements.";
  }
  poVar2 = ::std::operator<<((ostream *)local_198,pcVar5);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_198);
  return false;
}

Assistant:

bool CrateReader::ReadLayerOffsetArray(std::vector<LayerOffset> *d) {
  // array data is not compressed

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(size_t(n) * sizeof(LayerOffset));

  d->resize(size_t(n));

  if (!_sr->read(size_t(n) * sizeof(LayerOffset),
                 size_t(n) * sizeof(LayerOffset),
                 reinterpret_cast<uint8_t *>(d->data()))) {
    PUSH_ERROR("Failed to read LayerOffset[] data.");
    return false;
  }

  return true;
}